

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O0

void __thiscall
helics::CoreApp::processArgs
          (CoreApp *this,
          unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *app)

{
  string_view message;
  bool bVar1;
  CoreType CVar2;
  pointer this_00;
  undefined8 uVar3;
  __shared_ptr *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000068;
  CoreType in_stack_00000074;
  string_view in_stack_00000078;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  remArgs;
  shared_ptr<helics::Core> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff58 [15];
  undefined1 in_stack_ffffffffffffff67;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x4643e1);
  CLI::App::remaining_for_passthrough_abi_cxx11_
            ((App *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (bool)in_stack_ffffffffffffff67);
  this_00 = CLI::std::
            unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
            operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                        *)0x464400);
  CVar2 = helicsCLI11App::getCoreType(this_00);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  CoreFactory::create(in_stack_00000074,in_stack_00000078,in_stack_00000068);
  std::shared_ptr<helics::Core>::operator=
            ((shared_ptr<helics::Core> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x46447b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(CVar2,in_stack_ffffffffffffff50));
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDI);
  if (!bVar1) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(CVar2,in_stack_ffffffffffffff50),(char *)in_RDI);
    message._M_str._7_1_ = in_stack_ffffffffffffff67;
    message._0_15_ = in_stack_ffffffffffffff58;
    ConnectionFailure::ConnectionFailure
              ((ConnectionFailure *)CONCAT44(CVar2,in_stack_ffffffffffffff50),message);
    __cxa_throw(uVar3,&ConnectionFailure::typeinfo,ConnectionFailure::~ConnectionFailure);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(CVar2,in_stack_ffffffffffffff50));
  return;
}

Assistant:

void CoreApp::processArgs(std::unique_ptr<helicsCLI11App>& app)
{
    auto remArgs = app->remaining_for_passthrough();
    try {
        core = CoreFactory::create(app->getCoreType(), name, remArgs);
    }
    catch (...) {
        if (!remArgs.empty()) {
            name = remArgs.front();
        }
        if (!name.empty()) {
            core = CoreFactory::findCore(name);
            if (core) {
                // LCOV_EXCL_START
                name = core->getIdentifier();
                return;
                // LCOV_EXCL_STOP
            }
        }
    }
    if (!core) {
        throw(ConnectionFailure("Unable to create core\n"));
    }
}